

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O0

void __thiscall
AssertVisitor::operator()
          (AssertVisitor *this,
          VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
          *param_1,VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_L_>,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::TagT<391U,_Fixpp::Type::String>,_Fixpp::TagT<390U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
                   *param_2)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_78;
  AssertHelper local_58 [3];
  Message local_40;
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<_L_>,_Fixpp::Required<Fixpp::TagT<66U,_Fixpp::Type::String>_>,_Fixpp::TagT<391U,_Fixpp::Type::String>,_Fixpp::TagT<390U,_Fixpp::Type::String>,_Fixpp::Required<Fixpp::TagT<60U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<58U,_Fixpp::Type::String>,_Fixpp::TagT<354U,_Fixpp::Type::Int>,_Fixpp::TagT<355U,_Fixpp::Type::Data>_>
  *param_2_local;
  VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
  *param_1_local;
  AssertVisitor *this_local;
  
  local_31 = false;
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)param_2;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_78,(internal *)local_30,(AssertionResult *)"false","false","true",in_R9);
    message = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        (&local_78);
    testing::internal::AssertHelper::AssertHelper
              (local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x22e,message);
    testing::internal::AssertHelper::operator=(local_58,&local_40);
    testing::internal::AssertHelper::~AssertHelper(local_58);
    std::__cxx11::string::~string((string *)&local_78);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  return;
}

Assistant:

void operator()(Header, Message)
    {
        ASSERT_TRUE(false);
    }